

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sturm.cpp
# Opt level: O0

void __thiscall
opengv::math::Sturm::computeNegatedRemainder(Sturm *this,MatrixXd *p1,MatrixXd *p2,MatrixXd *r)

{
  Scalar *scalar;
  StorageBaseType *matrix;
  CoeffReturnType startRow;
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *this_00;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_01;
  CoeffReturnType pdVar1;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *other_00;
  double dVar2;
  MatrixXd poly_3;
  MatrixXd poly_2;
  MatrixXd poly_1;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *in_stack_fffffffffffffcc8;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *in_stack_fffffffffffffcd0;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *this_02;
  long *in_stack_fffffffffffffce0;
  int *in_stack_fffffffffffffce8;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_fffffffffffffcf0;
  undefined8 in_stack_fffffffffffffcf8;
  int blockRows;
  Index in_stack_fffffffffffffd00;
  double startCol;
  Index in_stack_fffffffffffffd08;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffd10;
  double *in_stack_fffffffffffffd18;
  
  blockRows = (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x12f2e6f);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,long>
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
            (in_stack_fffffffffffffcd0,(Index)in_stack_fffffffffffffcc8,0x12f2ea8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
            (in_stack_fffffffffffffcd0,(Index)in_stack_fffffffffffffcc8,0x12f2ed2);
  Eigen::operator*(in_stack_fffffffffffffd18,(StorageBaseType *)in_stack_fffffffffffffd10);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x12f2f21);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,long>
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,blockRows
             ,(long)in_stack_fffffffffffffcf0);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
             in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x12f2f6c);
  scalar = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      in_stack_fffffffffffffcd0,(Index)in_stack_fffffffffffffcc8,0x12f2f83);
  *scalar = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x12f2fae);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,long>
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  matrix = (StorageBaseType *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                     (in_stack_fffffffffffffcd0,(Index)in_stack_fffffffffffffcc8,0x12f2feb);
  startCol = *(double *)matrix;
  startRow = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       (in_stack_fffffffffffffcd0,(Index)in_stack_fffffffffffffcc8,0x12f3015);
  Eigen::operator*(scalar,matrix);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x12f3064);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,long>
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)matrix,(Index)startRow,
             (Index)startCol,blockRows,(long)in_stack_fffffffffffffcf0);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
             in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  this_00 = (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          in_stack_fffffffffffffcd0,(Index)in_stack_fffffffffffffcc8,0x12f30b8);
  *(Scalar *)this_00 = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x12f30e3);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,long>
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  other = (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
          Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                    (in_stack_fffffffffffffcd0,(Index)in_stack_fffffffffffffcc8,0x12f3120);
  dVar2 = -*(double *)other;
  this_01 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
            Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                      (in_stack_fffffffffffffcd0,(Index)in_stack_fffffffffffffcc8,0x12f3157);
  this_02 = (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
            (dVar2 * *(double *)this_01);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                     (this_02,(Index)in_stack_fffffffffffffcc8,0x12f318b);
  pow(*pdVar1,2.0);
  Eigen::operator*(scalar,matrix);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x12f31eb);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,long>
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)matrix,(Index)startRow,
             (Index)startCol,(int)((ulong)this_00 >> 0x20),(long)other);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)this_02,
             in_stack_fffffffffffffcc8);
  other_00 = (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)this_02,
                           (Index)in_stack_fffffffffffffcc8,0x12f323f);
  *(Scalar *)other_00 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator-(this_01);
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>>
  ::operator+(this_00,other);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,Eigen::Matrix<double,-1,-1,0,-1,-1>const>>
  ::operator+((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               *)this_00,other);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,Eigen::Matrix<double,-1,-1,0,-1,-1>const>>
  ::operator+((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               *)this_00,other);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)this_02,other_00);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x12f32e2);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x12f32ef);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x12f32fc);
  return;
}

Assistant:

void
opengv::math::Sturm::computeNegatedRemainder(
    const Eigen::MatrixXd & p1,
    const Eigen::MatrixXd & p2,
    Eigen::MatrixXd & r )
{
  //we have to create 3 subtraction polynomials
  Eigen::MatrixXd poly_1(1,p1.cols());
  poly_1.block(0,0,1,p2.cols()) = (p1(0,0)/p2(0,0)) * p2;
  poly_1(0,p1.cols()-1) = 0.0;

  Eigen::MatrixXd poly_2(1,p1.cols());
  poly_2.block(0,1,1,p2.cols()) = (p1(0,1)/p2(0,0)) * p2;
  poly_2(0,0) = 0.0;

  Eigen::MatrixXd poly_3(1,p1.cols());
  poly_3.block(0,1,1,p2.cols()) = (-p2(0,1)*p1(0,0)/pow(p2(0,0),2)) * p2;
  poly_3(0,0) = 0.0;

  //compute remainder
  r = -p1 + poly_1 + poly_2 + poly_3;
}